

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

void * tlp_cpld_data(tlp_cpl_hdr *ch)

{
  uint16_t *local_18;
  void *p;
  tlp_cpl_hdr *ch_local;
  
  if (((ch->tlp).fmt_type & 0x20) == 0) {
    local_18 = &ch[1].completer;
  }
  else {
    local_18 = &ch[1].requester;
  }
  return (void *)((long)local_18 + (long)(int)(ch->lowaddr & 3));
}

Assistant:

void *tlp_cpld_data(struct tlp_cpl_hdr *ch)
{
	void *p;

	p = tlp_is_3dw(ch->tlp.fmt_type) ?
		((char *)(ch + 1)) + 4 : ((char *)(ch + 1)) + 8;

	/* shift for padding due to 4DW alignment */
	p += (ch->lowaddr & 0x3);
	return p;
}